

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O2

bool benchmarkMany(uint32_t n,uint32_t m,uint32_t iterations,pospopcnt_u16_method_type fn,
                  bool verbose,bool test)

{
  int iVar1;
  int iVar2;
  uint16_t *puVar3;
  bool bVar4;
  uint uVar5;
  result_type rVar6;
  uint32_t uVar7;
  pointer pvVar8;
  pointer puVar9;
  byte bVar10;
  long lVar11;
  undefined7 in_register_00000089;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar17 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar19 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar20 [16];
  undefined1 in_ZMM3 [64];
  allocator_type local_293d;
  uint local_293c;
  byte local_2938;
  undefined3 uStack_2937;
  allocator_type local_2931;
  ulong local_2930;
  vector<int,_std::allocator<int>_> evts;
  vector<double,_std::allocator<double>_> avg;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> mins;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  vdata;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  allresults;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> results;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2868;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2850;
  _Vector_base<int,_std::allocator<int>_> local_2838;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2820;
  uniform_int_distribution<int> dis;
  LinuxEvents<0> unified;
  random_device rd;
  mt19937 gen;
  undefined1 auVar18 [64];
  
  evts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_293c = (uint)CONCAT71(in_register_00000089,test);
  evts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  evts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&rd,(ulong)n,
             (allocator_type *)&gen);
  local_2930 = (ulong)m;
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector(&vdata,(ulong)m,(value_type *)&rd,(allocator_type *)&unified);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&rd);
  rd.field_0._M_mt._M_x[0]._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&evts,(int *)&rd);
  rd.field_0._M_mt._M_x[0]._0_4_ = 1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&evts,(int *)&rd);
  rd.field_0._M_mt._M_x[0]._0_4_ = 5;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&evts,(int *)&rd);
  rd.field_0._M_mt._M_x[0]._0_4_ = 2;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&evts,(int *)&rd);
  rd.field_0._M_mt._M_x[0]._0_4_ = 3;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&evts,(int *)&rd);
  rd.field_0._M_mt._M_x[0]._0_4_ = 9;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&evts,(int *)&rd);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_2838,&evts);
  LinuxEvents<0>::LinuxEvents(&unified,(vector<int,_std::allocator<int>_> *)&local_2838);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2838);
  allresults.
  super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  results.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  results.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  results.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  allresults.
  super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  allresults.
  super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::resize
            (&results,(long)evts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)evts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2);
  std::random_device::random_device(&rd);
  uVar5 = std::random_device::_M_getval();
  auVar18._8_56_ = extraout_var;
  auVar18._0_8_ = extraout_XMM1_Qa;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&gen,(ulong)uVar5);
  lVar15 = local_2930 * 0x18;
  uVar7 = 0;
  dis._M_param._M_a = 0;
  dis._M_param._M_b = 0xffff;
  local_2938 = 1;
  uStack_2937 = 0;
  local_293c = local_293c ^ 1;
  do {
    auVar19 = in_ZMM2._0_16_;
    auVar17 = auVar18._0_16_;
    auVar20 = in_ZMM3._0_16_;
    if (uVar7 == iterations) {
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::vector(&local_2850,&allresults);
      compute_mins(&mins,&local_2850);
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::~vector(&local_2850);
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::vector(&local_2868,&allresults);
      compute_averages(&avg,&local_2868);
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::~vector(&local_2868);
      if (verbose) {
        auVar16 = vcvtuqq2pd_avx512vl(*(undefined1 (*) [16])
                                       mins.
                                       super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
        auVar17 = vshufpd_avx(auVar16,auVar16,1);
        auVar19 = vcvtusi2sd_avx512f(auVar20,m * n);
        printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, instructions per 16-bit word %4.3f \n"
               ,auVar17._0_8_ / auVar16._0_8_,auVar16._0_8_ / auVar19._0_8_,
               auVar17._0_8_ / auVar19._0_8_);
        printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu cache ref., %8llu cache mis.\n"
               ,*mins.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               mins.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
               _M_impl.super__Vector_impl_data._M_start[1],
               mins.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
               _M_impl.super__Vector_impl_data._M_start[2],
               mins.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
               _M_impl.super__Vector_impl_data._M_start[3],
               mins.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
               _M_impl.super__Vector_impl_data._M_start[4]);
        printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f cache ref., %8.1f cache mis.\n"
               ,*avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
               avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[1],
               avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[2],
               avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[3],
               avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[4]);
      }
      else {
        auVar20 = vcvtusi2sd_avx512f(auVar17,*mins.
                                              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
        auVar17 = vcvtusi2sd_avx512f(auVar17,m * n);
        auVar19 = vcvtusi2sd_avx512f(auVar19,mins.
                                             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start[5]);
        printf("cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n",
               auVar20._0_8_ / auVar17._0_8_,auVar19._0_8_ / auVar17._0_8_);
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&avg.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
                (&mins.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
      bVar10 = local_2938;
      goto LAB_00111cea;
    }
    pvVar8 = vdata.
             super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar12 = 0;
        uVar12 < (ulong)(((long)vdata.
                                super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8) / 0x18);
        uVar12 = uVar12 + 1) {
      puVar9 = pvVar8[uVar12].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start;
      for (uVar13 = 0;
          uVar13 < (ulong)((long)pvVar8[uVar12].
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 1);
          uVar13 = uVar13 + 1) {
        rVar6 = std::uniform_int_distribution<int>::operator()(&dis,&gen);
        puVar9 = vdata.
                 super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar12].
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar9[uVar13] = (unsigned_short)rVar6;
        pvVar8 = vdata.
                 super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&avg,0x10,
               (allocator_type *)&local_2820);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&mins,local_2930,(value_type *)&avg,&local_293d);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&avg);
    for (lVar14 = 0; lVar15 - lVar14 != 0; lVar14 = lVar14 + 0x18) {
      puVar3 = *(uint16_t **)
                ((long)&((vdata.
                          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                        .super__Vector_impl_data._M_start + lVar14);
      pospopcnt_u16_scalar_naive
                (puVar3,(uint32_t)
                        ((ulong)(*(long *)((long)&((vdata.
                                                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish +
                                          lVar14) - (long)puVar3) >> 1),
                 *(uint32_t **)
                  ((long)mins.
                         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar14));
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2820,0x10,
               (allocator_type *)&local_293d);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&avg,local_2930,(value_type *)&local_2820,&local_2931);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2820);
    LinuxEvents<0>::start(&unified);
    for (lVar14 = 0; lVar15 - lVar14 != 0; lVar14 = lVar14 + 0x18) {
      puVar3 = *(uint16_t **)
                ((long)&((vdata.
                          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                        .super__Vector_impl_data._M_start + lVar14);
      (*fn)(puVar3,(uint32_t)
                   ((ulong)(*(long *)((long)&((vdata.
                                               super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                             )._M_impl.super__Vector_impl_data._M_finish + lVar14) -
                           (long)puVar3) >> 1),
            *(uint32_t **)
             ((long)avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar14));
      auVar18._8_56_ = extraout_var_00;
      auVar18._0_8_ = extraout_XMM1_Qa_00;
    }
    LinuxEvents<0>::end(&unified,&results);
    lVar14 = 0;
    for (uVar12 = 0; uVar12 != local_2930; uVar12 = uVar12 + 1) {
      for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
        lVar14 = lVar14 + (ulong)*(uint *)((long)avg.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_start
                                                 [uVar12 * 3] + lVar11 * 4);
      }
    }
    if (lVar14 == 0) {
      bVar4 = false;
    }
    else {
      for (uVar12 = 0; uVar12 != local_2930; uVar12 = uVar12 + 1) {
        for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 1) {
          iVar1 = *(int *)(mins.
                           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar12 * 3] + lVar14 * 4);
          iVar2 = *(int *)((long)avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar12 * 3] + lVar14 * 4);
          if (iVar1 != iVar2 && (char)local_293c == '\0') {
            puts("bug:");
            bVar4 = false;
            printf("expected : ");
            print16((uint32_t *)
                    mins.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar12 * 3]);
            printf("got      : ");
            print16((uint32_t *)
                    avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar12 * 3]);
            goto LAB_00111b58;
          }
          local_2938 = local_2938 & iVar1 == iVar2;
        }
      }
      bVar4 = true;
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::push_back(&allresults,&results);
    }
LAB_00111b58:
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&avg);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&mins);
    uVar7 = uVar7 + 1;
  } while (bVar4);
  bVar10 = 0;
LAB_00111cea:
  std::random_device::~random_device(&rd);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector(&allresults);
  std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
            (&results.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
  LinuxEvents<0>::~LinuxEvents(&unified);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&vdata);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&evts.super__Vector_base<int,_std::allocator<int>_>);
  return (bool)(bVar10 & 1);
}

Assistant:

bool benchmarkMany(uint32_t n, uint32_t m, uint32_t iterations, pospopcnt_u16_method_type fn, bool verbose, bool test) {
    std::vector<int> evts;
    std::vector<std::vector<uint16_t>> vdata(m, std::vector<uint16_t>(n));
    evts.push_back(PERF_COUNT_HW_CPU_CYCLES);
    evts.push_back(PERF_COUNT_HW_INSTRUCTIONS);
    evts.push_back(PERF_COUNT_HW_BRANCH_MISSES);
    evts.push_back(PERF_COUNT_HW_CACHE_REFERENCES);
    evts.push_back(PERF_COUNT_HW_CACHE_MISSES);
    evts.push_back(PERF_COUNT_HW_REF_CPU_CYCLES);
    LinuxEvents<PERF_TYPE_HARDWARE> unified(evts);
    std::vector<unsigned long long> results; // tmp buffer
    std::vector< std::vector<unsigned long long> > allresults;
    results.resize(evts.size());
    
    std::random_device rd;
    std::mt19937 gen(rd());
    std::uniform_int_distribution<> dis(0, 0xFFFF);

    bool isok = true;
    for (uint32_t i = 0; i < iterations; i++) {
        for (size_t k = 0; k < vdata.size(); k++) {
            for(size_t k2 = 0; k2 < vdata[k].size() ; k2++) { 
               vdata[k][k2] = dis(gen); // random init.
            }
        }
        std::vector<std::vector<uint32_t>> correctflags(m,std::vector<uint32_t>(16));
        for (size_t k = 0; k < m; k++) {
          pospopcnt_u16_scalar_naive(vdata[k].data(), vdata[k].size(), correctflags[k].data()); // this is our gold standard
        }
        std::vector<std::vector<uint32_t>> flags(m,std::vector<uint32_t>(16));
        
        unified.start();
        for (size_t k = 0; k < m ; k++) {
          fn(vdata[k].data(), vdata[k].size(), flags[k].data());
        }
        unified.end(results);

        uint64_t tot_obs = 0;
        for (size_t km = 0; km < m; ++km)
          for (size_t k = 0; k < 16; ++k) tot_obs += flags[km][k];
        if (tot_obs == 0) { // when a method is not supported it returns all zero
            return false;
        }
        for (size_t km = 0; km < m; ++km) {
          for (size_t k = 0; k < 16; k++) {
            if (correctflags[km][k] != flags[km][k]) {
                if (test) {
                    printf("bug:\n");
                    printf("expected : ");
                    print16(correctflags[km].data());
                    printf("got      : ");
                    print16(flags[km].data());
                    return false;
                } else {
                    isok = false;
                }
            }
          }
        }
        allresults.push_back(results);
    }

    std::vector<unsigned long long> mins = compute_mins(allresults);
    std::vector<double> avg = compute_averages(allresults);
    
    if (verbose) {
        printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, "
               "instructions per 16-bit word %4.3f \n",
                double(mins[1]) / mins[0], double(mins[0]) / (n*m), double(mins[1]) / (n*m));
        // first we display mins
        printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu "
               "cache ref., %8llu cache mis.\n",
                mins[0], mins[1], mins[2], mins[3], mins[4]);
        printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f "
               "cache ref., %8.1f cache mis.\n",
                avg[0], avg[1], avg[2], avg[3], avg[4]);
    } else {
        printf("cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n", double(mins[0]) / (n*m), double(mins[5]) / (n*m));
    }

    return isok;
}